

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cf95::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody
          (ArenaTest_FuzzAllocSpaceAllocatedRace_Test *this)

{
  pointer ptVar1;
  size_type __n;
  pointer __result;
  thread *ptVar2;
  void *pvVar3;
  anon_class_16_2_f6a74b90_for__M_head_impl *__args;
  thread *t;
  pointer ptVar4;
  ulong uVar5;
  bool bVar6;
  Time TVar7;
  Time TVar8;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:618:40)>
  reset_max_block_size;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  upb_Arena *arena;
  Notification done;
  thread local_40;
  upb_Arena **local_38;
  
  upb_Arena_SetMaxBlockSize(0x80);
  reset_max_block_size.storage_.is_callback_engaged_ = true;
  arena = upb_Arena_New();
  local_38 = &arena;
  local_40._M_id._M_thread = (id)&done;
  done.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  done.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                  (&threads,1,"vector::_M_realloc_insert");
  ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                       (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,__n);
  std::allocator_traits<std::allocator<std::thread>>::
  construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzAllocSpaceAllocatedRace_Test::TestBody()::__1>
            ((allocator_type *)((long)__result - (long)ptVar1),&local_40,__args);
  ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                     (ptVar1,(thread *)0x0,__result,(allocator<std::thread> *)&threads);
  ptVar2 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                     ((thread *)0x0,ptVar4,ptVar2 + 1,(allocator<std::thread> *)&threads);
  std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
            ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar1,
             (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage - (long)ptVar1 >> 3);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __result + __n;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = __result;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = ptVar2;
  TVar7 = absl::lts_20250127::Now();
  uVar5 = 0;
  TVar7 = absl::lts_20250127::operator+(TVar7,(Duration)ZEXT812(2));
  do {
    TVar8 = absl::lts_20250127::Now();
    if (TVar8.rep_.rep_hi_ == TVar7.rep_.rep_hi_) {
      bVar6 = TVar8.rep_.rep_lo_ < TVar7.rep_.rep_lo_;
    }
    else {
      bVar6 = (long)TVar8.rep_.rep_hi_ < (long)TVar7.rep_.rep_hi_;
    }
    if ((!bVar6) || (9999999 < uVar5)) break;
    pvVar3 = ::upb_Arena_Malloc(arena,0x80);
    uVar5 = uVar5 + 0x80;
  } while (pvVar3 != (void *)0x0);
  absl::lts_20250127::Notification::Notify(&done);
  ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  upb_Arena_Free(arena);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  absl::lts_20250127::Notification::~Notification(&done);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:618:40)>
  ::~Cleanup(&reset_max_block_size);
  return;
}

Assistant:

TEST(ArenaTest, FuzzAllocSpaceAllocatedRace) {
  upb_Arena_SetMaxBlockSize(128);
  absl::Cleanup reset_max_block_size = [] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
  };
  upb_Arena* arena = upb_Arena_New();
  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 1; ++i) {
    threads.emplace_back([&]() {
      while (!done.HasBeenNotified()) {
        size_t count;
        upb_Arena_SpaceAllocated(arena, &count);
      }
    });
  }

  auto end = absl::Now() + absl::Seconds(2);
  uintptr_t total = 0;
  while (absl::Now() < end && total < 10000000) {
    if (upb_Arena_Malloc(arena, 128) == nullptr) {
      break;
    }
    total += 128;
  }
  done.Notify();
  for (auto& t : threads) t.join();
  upb_Arena_Free(arena);
}